

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O2

void __thiscall
mp::BasicFlatModelAPI::
AddConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
          (BasicFlatModelAPI *this,
          CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
          *param_1)

{
  Error *this_00;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Not handling constraint type \'",&local_79);
  std::operator+(&local_58,&local_78,"PowConstExp");
  std::operator+(&local_38,&local_58,"\'. Provide a handler or a converter method");
  Error::Error(this_00,(CStringRef)local_38._M_dataplus._M_p,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddConstraint(const Constraint& ) {
    MP_RAISE(
          std::string("Not handling constraint type '") +
          Constraint::GetTypeName() +
          "'. Provide a handler or a converter method");
  }